

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O0

bool __thiscall slang::parsing::Parser::isSequenceRepetition(Parser *this)

{
  ParserBase *this_00;
  undefined8 in_RDI;
  Token TVar1;
  uint32_t offset;
  ParserBase *in_stack_ffffffffffffffc8;
  TokenKind local_30;
  int local_20;
  bool local_1;
  
  offset = (uint32_t)((ulong)in_RDI >> 0x20);
  TVar1 = ParserBase::peek(in_stack_ffffffffffffffc8,offset);
  local_20 = TVar1._0_4_;
  this_00 = (ParserBase *)(ulong)(local_20 - 0x1bU & 0xffff);
  switch(this_00) {
  case (ParserBase *)0x0:
  case (ParserBase *)0xb:
  case (ParserBase *)0x19:
    local_1 = true;
    break;
  default:
    local_1 = false;
    break;
  case (ParserBase *)0x3:
    TVar1 = ParserBase::peek(this_00,offset);
    local_30 = TVar1.kind;
    local_1 = local_30 == CloseBracket;
  }
  return local_1;
}

Assistant:

bool Parser::isSequenceRepetition() {
    switch (peek(1).kind) {
        case TokenKind::Star:
        case TokenKind::Equals:
        case TokenKind::MinusArrow:
            return true;
        case TokenKind::Plus:
            return peek(2).kind == TokenKind::CloseBracket;
        default:
            return false;
    }
}